

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O2

SequenceD<64> * __thiscall
DESinv::operator()(SequenceD<64> *__return_storage_ptr__,DESinv *this,SequenceD<64> *seq)

{
  int iVar1;
  bool bVar2;
  SequenceD<64> tmp;
  SequenceD<64> swapSeq;
  Sequence tempSeq;
  Sequence local_1c0;
  Sequence xorSeq;
  Finv f_inv;
  
  Finv::Finv(&f_inv,&this->m_key);
  Permutation<64,_64>::operator()(&tmp,(Permutation<64,_64> *)&swapSeq,seq,&INITIAL_PERMUTATION);
  iVar1 = 0x10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    Finv::operator()(&tempSeq,&f_inv,&tmp.m_other);
    Sequence::Sequence(&local_1c0,&tempSeq);
    Sequence::operator*(&xorSeq,&tmp.super_Sequence,&local_1c0);
    Sequence::~Sequence(&local_1c0);
    SequenceD<64>::SequenceD(&swapSeq,&tmp.m_other,&xorSeq);
    SequenceD<64>::operator=(&tmp,&swapSeq);
    SequenceD<64>::~SequenceD(&swapSeq);
    Sequence::~Sequence(&xorSeq);
    Sequence::~Sequence(&tempSeq);
  }
  SequenceD<64>::SequenceD(&swapSeq,&tmp.m_other,&tmp.super_Sequence);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,(Permutation<64,_64> *)&tempSeq,&swapSeq,
             &INITIAL_PERMUTATION_REVERSE);
  SequenceD<64>::~SequenceD(&swapSeq);
  SequenceD<64>::~SequenceD(&tmp);
  Finv::~Finv(&f_inv);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DESinv::operator()(SequenceD<64> seq) {
    Finv f_inv(m_key);
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    for (int i = 0; i < 16; ++i) {
        auto tempSeq = f_inv(tmp.right());
        auto xorSeq = tmp.left() * tempSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>()(swapSeq, INITIAL_PERMUTATION_REVERSE);
}